

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O1

void * ym2612_init(void *param,UINT32 clock,UINT32 rate,FM_TIMERHANDLER timer_handler,
                  FM_IRQHANDLER IRQHandler)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  YM2612 *F2612;
  uint uVar4;
  
  pvVar2 = calloc(1,0x5120);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    init_tables();
    *(void **)((long)pvVar2 + 0x210) = param;
    *(undefined1 *)((long)pvVar2 + 0x208) = 0xe;
    *(long *)((long)pvVar2 + 0x6a0) = (long)pvVar2 + 0x4778;
    *(UINT32 *)((long)pvVar2 + 0x218) = clock;
    *(UINT32 *)((long)pvVar2 + 0x21c) = rate;
    uVar4 = rate - clock / 0x90;
    uVar1 = -uVar4;
    if (0 < (int)uVar4) {
      uVar1 = uVar4;
    }
    *(bool *)((long)pvVar2 + 0x209) = uVar1 < 3;
    *(FM_TIMERHANDLER *)((long)pvVar2 + 0x648) = timer_handler;
    *(FM_IRQHANDLER *)((long)pvVar2 + 0x650) = IRQHandler;
    *(undefined1 *)((long)pvVar2 + 0x20a) = 0;
    *(undefined1 *)((long)pvVar2 + 0x5111) = 0;
    *(code **)((long)pvVar2 + 0x658) = ssgdummy_set_clock;
    *(code **)((long)pvVar2 + 0x660) = ssgdummy_write;
    *(code **)((long)pvVar2 + 0x668) = ssgdummy_read;
    *(code **)((long)pvVar2 + 0x670) = ssgdummy_reset;
    *(undefined8 *)((long)pvVar2 + 0x678) = 0;
    *(undefined8 *)((long)pvVar2 + 0x4750) = 0;
    *(undefined8 *)((long)pvVar2 + 0x4758) = 0;
    lVar3 = 0x4908;
    do {
      *(undefined1 *)((long)pvVar2 + lVar3) = 0;
      lVar3 = lVar3 + 0x198;
    } while (lVar3 != 0x5298);
    *(undefined1 *)((long)pvVar2 + 0x5110) = 0;
  }
  return pvVar2;
}

Assistant:

void * ym2612_init(void *param, UINT32 clock, UINT32 rate,
				FM_TIMERHANDLER timer_handler,FM_IRQHANDLER IRQHandler)
{
	YM2612 *F2612;

	/* allocate extend state space */
	F2612 = (YM2612 *)calloc(1, sizeof(YM2612));
	if (F2612 == NULL)
		return NULL;

	/* allocate total level table (128kb space) */
	init_tables();

	/* FM */
	F2612->OPN.ST.param = param;
	F2612->OPN.type = TYPE_YM2612;
	F2612->OPN.P_CH = F2612->CH;
	F2612->OPN.ST.clock = clock;
	F2612->OPN.ST.rate = rate;
	OPNCheckNativeSampleRate(&F2612->OPN);
	/* Extend handler */
	F2612->OPN.ST.timer_handler = timer_handler;
	F2612->OPN.ST.IRQ_Handler   = IRQHandler;
	F2612->OPN.LegacyMode = 0x00;
	F2612->WaveOutMode = 0x00;
	OPNLinkSSG(&F2612->OPN, NULL, NULL);
	OPNSetSmplRateChgCallback(&F2612->OPN, NULL, NULL);

	ym2612_set_mute_mask(F2612, 0x00);

	return F2612;
}